

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFilteringTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::TextureCubeArrayFilteringCase::init
          (TextureCubeArrayFilteringCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
  *pvVar1;
  int numLayers;
  pointer pPVar2;
  TextureFormat TVar3;
  TextureFormat TVar4;
  bool bVar5;
  int i;
  ContextType ctxType;
  int iVar6;
  int extraout_EAX;
  long lVar7;
  TextureCubeArray *pTVar8;
  RenderTarget *pRVar9;
  NotSupportedError *this_00;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  float fVar19;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  Vec4 gMax;
  long local_1a8;
  PixelBufferAccess levelBuf;
  Vector<float,_4> res_7;
  Vec4 gMin;
  Vec4 cScale;
  Vec4 cBias;
  Vector<float,_4> res_1;
  Vector<float,_4> res_6;
  TextureFormatInfo fmtInfo;
  IVec4 levelSwz [4];
  TextureFormat texFmt;
  RGBA local_40 [4];
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar5 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar5) {
    bVar5 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_texture_cube_map_array");
    if (!bVar5) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      fmtInfo.valueMin.m_data._0_8_ = &fmtInfo.valueMax;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&fmtInfo,"GL_EXT_texture_cube_map_array not supported","");
      tcu::NotSupportedError::NotSupportedError(this_00,(string *)&fmtInfo);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  texFmt = glu::mapGLInternalFormat(this->m_internalFormat);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  cScale.m_data[0] = 0.0;
  cScale.m_data[1] = 0.0;
  cScale.m_data[2] = 0.0;
  cScale.m_data[3] = 0.0;
  lVar7 = 0;
  do {
    cScale.m_data[lVar7] = fmtInfo.valueMax.m_data[lVar7] - fmtInfo.valueMin.m_data[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  cBias.m_data[0] = fmtInfo.valueMin.m_data[0];
  cBias.m_data[1] = fmtInfo.valueMin.m_data[1];
  cBias.m_data[2] = fmtInfo.valueMin.m_data[2];
  cBias.m_data[3] = fmtInfo.valueMin.m_data[3];
  uVar12 = this->m_size;
  uVar17 = 0x20;
  if (uVar12 != 0) {
    uVar17 = 0x1f;
    if (uVar12 != 0) {
      for (; uVar12 >> uVar17 == 0; uVar17 = uVar17 - 1) {
      }
    }
    uVar17 = uVar17 ^ 0x1f;
  }
  numLayers = this->m_depth;
  pTVar8 = (TextureCubeArray *)operator_new(0x68);
  glu::TextureCubeArray::TextureCubeArray
            (pTVar8,((this->super_TestCase).m_context)->m_renderCtx,this->m_internalFormat,uVar12,
             numLayers);
  this->m_gradientTex = pTVar8;
  pTVar8 = (TextureCubeArray *)operator_new(0x68);
  glu::TextureCubeArray::TextureCubeArray
            (pTVar8,((this->super_TestCase).m_context)->m_renderCtx,this->m_internalFormat,
             this->m_size,this->m_depth);
  this->m_gridTex = pTVar8;
  levelSwz[0].m_data[0] = 0;
  levelSwz[0].m_data[1] = 1;
  levelSwz[0].m_data[2] = 2;
  levelSwz[0].m_data[3] = 3;
  levelSwz[1].m_data[0] = 2;
  levelSwz[1].m_data[1] = 1;
  levelSwz[1].m_data[2] = 3;
  levelSwz[1].m_data[3] = 0;
  levelSwz[2].m_data[0] = 3;
  levelSwz[2].m_data[1] = 0;
  levelSwz[2].m_data[2] = 1;
  levelSwz[2].m_data[3] = 2;
  levelSwz[3].m_data[0] = 1;
  levelSwz[3].m_data[1] = 3;
  levelSwz[3].m_data[2] = 2;
  levelSwz[3].m_data[3] = 0;
  if (uVar12 != 0) {
    iVar6 = 0x1f - uVar17;
    local_1a8 = 0;
    iVar16 = 0;
    if (0 < iVar6) {
      iVar16 = iVar6;
    }
    uVar18 = 0;
    do {
      tcu::TextureCubeArray::allocLevel(&this->m_gradientTex->m_refTexture,(int)uVar18);
      pPVar2 = (this->m_gradientTex->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      levelBuf.super_ConstPixelBufferAccess.m_format = *(TextureFormat *)(pPVar2 + uVar18);
      lVar7 = 2;
      do {
        levelBuf.super_ConstPixelBufferAccess.m_size.m_data[lVar7 + -2] =
             *(int *)((long)(pPVar2->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar7 * 4 + local_1a8 + -8);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 5);
      lVar7 = 5;
      do {
        levelBuf.super_ConstPixelBufferAccess.m_size.m_data[lVar7 + -2] =
             *(int *)((long)(pPVar2->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar7 * 4 + local_1a8 + -8);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 8);
      levelBuf.super_ConstPixelBufferAccess.m_data = (void *)((TextureFormat *)(pPVar2 + uVar18))[4]
      ;
      if (0 < this->m_depth) {
        uVar12 = 0;
        do {
          uVar13 = (ulong)((uVar12 & 3) << 4);
          lVar7 = (long)*(int *)((long)levelSwz[0].m_data + uVar13 + 0xc);
          lVar10 = (long)*(int *)((long)levelSwz[0].m_data + uVar13 + 8);
          lVar11 = (long)*(int *)((long)levelSwz[0].m_data + uVar13 + 4);
          lVar14 = (long)*(int *)((long)levelSwz[0].m_data + uVar13);
          local_1c8 = 0;
          uStack_1c0 = 0x3f80000000000000;
          gMax.m_data[1] = *(float *)((long)&local_1c8 + lVar11 * 4);
          gMax.m_data[0] = *(float *)((long)&local_1c8 + lVar14 * 4);
          gMax.m_data[3] = *(float *)((long)&local_1c8 + lVar7 * 4);
          gMax.m_data[2] = *(float *)((long)&local_1c8 + lVar10 * 4);
          res_1.m_data[0] = 0.0;
          res_1.m_data[1] = 0.0;
          res_1.m_data[2] = 0.0;
          res_1.m_data[3] = 0.0;
          lVar15 = 0;
          do {
            res_1.m_data[lVar15] = gMax.m_data[lVar15] * cScale.m_data[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar15 != 4);
          gMin.m_data[0] = 0.0;
          gMin.m_data[1] = 0.0;
          gMin.m_data[2] = 0.0;
          gMin.m_data[3] = 0.0;
          lVar15 = 0;
          do {
            gMin.m_data[lVar15] = res_1.m_data[lVar15] + cBias.m_data[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar15 != 4);
          res_7.m_data._0_8_ = &DAT_3f8000003f800000;
          res_7.m_data[2] = 1.0;
          res_7.m_data[3] = 0.0;
          local_1c8 = CONCAT44(res_7.m_data[lVar11],res_7.m_data[lVar14]);
          uStack_1c0 = CONCAT44(res_7.m_data[lVar7],res_7.m_data[lVar10]);
          res_1.m_data[0] = 0.0;
          res_1.m_data[1] = 0.0;
          res_1.m_data[2] = 0.0;
          res_1.m_data[3] = 0.0;
          lVar7 = 0;
          do {
            res_1.m_data[lVar7] = *(float *)((long)&local_1c8 + lVar7 * 4) * cScale.m_data[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          gMax.m_data[0] = 0.0;
          gMax.m_data[1] = 0.0;
          gMax.m_data[2] = 0.0;
          gMax.m_data[3] = 0.0;
          lVar7 = 0;
          do {
            gMax.m_data[lVar7] = res_1.m_data[lVar7] + cBias.m_data[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          tcu::getSubregion((PixelBufferAccess *)&res_1,&levelBuf,0,0,uVar12,
                            levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0],
                            levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1],1);
          tcu::fillWithComponentGradients((PixelBufferAccess *)&res_1,&gMin,&gMax);
          uVar12 = uVar12 + 1;
        } while ((int)uVar12 < this->m_depth);
      }
      uVar18 = uVar18 + 1;
      local_1a8 = local_1a8 + 0x28;
    } while (uVar18 != iVar16 + 1);
    lVar7 = 0;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    uVar18 = 0;
    do {
      tcu::TextureCubeArray::allocLevel(&this->m_gridTex->m_refTexture,(int)uVar18);
      pPVar2 = (this->m_gridTex->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      levelBuf.super_ConstPixelBufferAccess.m_format = *(TextureFormat *)(pPVar2 + uVar18);
      lVar10 = 2;
      do {
        levelBuf.super_ConstPixelBufferAccess.m_size.m_data[lVar10 + -2] =
             *(int *)((long)(pPVar2->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar10 * 4 + lVar7 + -8);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 5);
      lVar10 = 5;
      do {
        levelBuf.super_ConstPixelBufferAccess.m_size.m_data[lVar10 + -2] =
             *(int *)((long)(pPVar2->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar10 * 4 + lVar7 + -8);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 8);
      levelBuf.super_ConstPixelBufferAccess.m_data =
           *(void **)((TextureFormat *)(pPVar2 + uVar18) + 4);
      if (0 < this->m_depth) {
        iVar16 = 0;
        do {
          tcu::getSubregion((PixelBufferAccess *)&res_1,&levelBuf,0,0,iVar16,
                            levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0],
                            levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1],1);
          tcu::RGBA::toVec((RGBA *)&local_1c8);
          gMax.m_data[0] = 0.0;
          gMax.m_data[1] = 0.0;
          gMax.m_data[2] = 0.0;
          gMax.m_data[3] = 0.0;
          lVar10 = 0;
          do {
            gMax.m_data[lVar10] = *(float *)((long)&local_1c8 + lVar10 * 4) * cScale.m_data[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          gMin.m_data[0] = 0.0;
          gMin.m_data[1] = 0.0;
          gMin.m_data[2] = 0.0;
          gMin.m_data[3] = 0.0;
          lVar10 = 0;
          do {
            gMin.m_data[lVar10] = gMax.m_data[lVar10] + cBias.m_data[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          tcu::RGBA::toVec(local_40);
          res_6.m_data[0] = 0.0;
          res_6.m_data[1] = 0.0;
          res_6.m_data[2] = 0.0;
          res_6.m_data[3] = 0.0;
          lVar10 = 0;
          do {
            res_6.m_data[lVar10] = (float)local_40[lVar10].m_value * cScale.m_data[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          res_7.m_data[0] = 0.0;
          res_7.m_data[1] = 0.0;
          res_7.m_data[2] = 0.0;
          res_7.m_data[3] = 0.0;
          lVar10 = 0;
          do {
            res_7.m_data[lVar10] = res_6.m_data[lVar10] + cBias.m_data[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          tcu::fillWithGrid((PixelBufferAccess *)&res_1,4,&gMin,&res_7);
          iVar16 = iVar16 + 1;
        } while (iVar16 < this->m_depth);
      }
      uVar18 = uVar18 + 1;
      lVar7 = lVar7 + 0x28;
    } while (uVar18 != iVar6 + 1);
  }
  glu::TextureCubeArray::upload(this->m_gradientTex);
  glu::TextureCubeArray::upload(this->m_gridTex);
  TVar3 = (TextureFormat)this->m_gradientTex;
  TVar4 = (TextureFormat)this->m_gridTex;
  if (this->m_onlySampleFaceInterior == true) {
    fVar19 = (float)(numLayers / 6) + 0.5;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x40b33333;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = -0x40b33333;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3f4ccccd;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3f4ccccd;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = (int)fVar19;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = -0x41000000;
    pvVar1 = &this->m_cases;
    levelBuf.super_ConstPixelBufferAccess.m_format = TVar3;
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
              (pvVar1,(FilterCase *)&levelBuf);
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3f000000;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f266666;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3f4ccccd;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3f4ccccd;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = -0x41000000;
    levelBuf.super_ConstPixelBufferAccess.m_format = TVar3;
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
              (pvVar1,(FilterCase *)&levelBuf);
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x40b33333;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = -0x40b33333;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3f4ccccd;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3f4ccccd;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = -0x41000000;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = (int)fVar19;
    levelBuf.super_ConstPixelBufferAccess.m_format = TVar4;
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
              (pvVar1,(FilterCase *)&levelBuf);
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3e4ccccd;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3e4ccccd;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3f19999a;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3f000000;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = -0x41000000;
    levelBuf.super_ConstPixelBufferAccess.m_format = TVar4;
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
              (pvVar1,(FilterCase *)&levelBuf);
  }
  else {
    pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar16 = pRVar9->m_numSamples;
    pvVar1 = &this->m_cases;
    fVar19 = (float)(numLayers / 6) + 0.5;
    if (iVar16 == 0) {
      levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x40600000;
      levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = -0x40666666;
      levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3f99999a;
      levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3fa00000;
      levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = (int)fVar19;
      levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = -0x41000000;
      levelBuf.super_ConstPixelBufferAccess.m_format = TVar3;
      std::
      vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
      ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
                (pvVar1,(FilterCase *)&levelBuf);
    }
    else {
      levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x4067ae14;
      levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = -0x4059999a;
      levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3f8ccccd;
      levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3faccccd;
      levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = (int)fVar19;
      levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = -0x41000000;
      levelBuf.super_ConstPixelBufferAccess.m_format = TVar3;
      std::
      vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
      ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
                (pvVar1,(FilterCase *)&levelBuf);
    }
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3f4ccccd;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f4ccccd;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3fa00000;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3f99999a;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = (int)fVar19;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = -0x41000000;
    levelBuf.super_ConstPixelBufferAccess.m_format = TVar3;
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
              (pvVar1,(FilterCase *)&levelBuf);
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x4067ae14;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = -0x4059999a;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3f8ccccd;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3faccccd;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = -0x41000000;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = (int)fVar19;
    levelBuf.super_ConstPixelBufferAccess.m_format = TVar4;
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
              (pvVar1,(FilterCase *)&levelBuf);
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x40666666;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = -0x40733333;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = -0x40b33333;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = -0x40b33333;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = -0x41000000;
    levelBuf.super_ConstPixelBufferAccess.m_format = TVar4;
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
              (pvVar1,(FilterCase *)&levelBuf);
    if (0xb < numLayers && iVar16 == 0) {
      levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x40000000;
      levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = -0x40400000;
      levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = -0x42333333;
      levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3f666666;
      levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0x3fc00054;
      levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0x3fbfffac;
      levelBuf.super_ConstPixelBufferAccess.m_format = TVar3;
      std::
      vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
      ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
                (pvVar1,(FilterCase *)&levelBuf);
    }
  }
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void TextureCubeArrayFilteringCase::init (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_cube_map_array"))
		throw tcu::NotSupportedError("GL_EXT_texture_cube_map_array not supported");

	try
	{
		const tcu::TextureFormat		texFmt		= glu::mapGLInternalFormat(m_internalFormat);
		const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
		const tcu::Vec4					cScale		= fmtInfo.valueMax-fmtInfo.valueMin;
		const tcu::Vec4					cBias		= fmtInfo.valueMin;
		const int						numLevels	= deLog2Floor32(m_size) + 1;
		const int						numLayers	= m_depth / 6;

		// Create textures.
		m_gradientTex	= new glu::TextureCubeArray(m_context.getRenderContext(), m_internalFormat, m_size, m_depth);
		m_gridTex		= new glu::TextureCubeArray(m_context.getRenderContext(), m_internalFormat, m_size, m_depth);

		const tcu::IVec4 levelSwz[] =
		{
			tcu::IVec4(0,1,2,3),
			tcu::IVec4(2,1,3,0),
			tcu::IVec4(3,0,1,2),
			tcu::IVec4(1,3,2,0),
		};

		// Fill first gradient texture (gradient direction varies between layers).
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			m_gradientTex->getRefTexture().allocLevel(levelNdx);

			const tcu::PixelBufferAccess levelBuf = m_gradientTex->getRefTexture().getLevel(levelNdx);

			for (int layerFaceNdx = 0; layerFaceNdx < m_depth; layerFaceNdx++)
			{
				const tcu::IVec4	swz		= levelSwz[layerFaceNdx % DE_LENGTH_OF_ARRAY(levelSwz)];
				const tcu::Vec4		gMin	= tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f).swizzle(swz[0],swz[1],swz[2],swz[3])*cScale + cBias;
				const tcu::Vec4		gMax	= tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f).swizzle(swz[0],swz[1],swz[2],swz[3])*cScale + cBias;

				tcu::fillWithComponentGradients(tcu::getSubregion(levelBuf, 0, 0, layerFaceNdx, levelBuf.getWidth(), levelBuf.getHeight(), 1), gMin, gMax);
			}
		}

		// Fill second with grid texture (each layer has unique colors).
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			m_gridTex->getRefTexture().allocLevel(levelNdx);

			const tcu::PixelBufferAccess levelBuf = m_gridTex->getRefTexture().getLevel(levelNdx);

			for (int layerFaceNdx = 0; layerFaceNdx < m_depth; layerFaceNdx++)
			{
				const deUint32	step	= 0x00ffffff / (numLevels*m_depth - 1);
				const deUint32	rgb		= step * (levelNdx + layerFaceNdx*numLevels);
				const deUint32	colorA	= 0xff000000 | rgb;
				const deUint32	colorB	= 0xff000000 | ~rgb;

				tcu::fillWithGrid(tcu::getSubregion(levelBuf, 0, 0, layerFaceNdx, levelBuf.getWidth(), levelBuf.getHeight(), 1),
								  4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}
		}

		// Upload.
		m_gradientTex->upload();
		m_gridTex->upload();

		// Test cases
		{
			const glu::TextureCubeArray* const	tex0	= m_gradientTex;
			const glu::TextureCubeArray* const	tex1	= m_gridTex;

			if (m_onlySampleFaceInterior)
			{
				m_cases.push_back(FilterCase(tex0, tcu::Vec2(-0.8f, -0.8f),	tcu::Vec2(0.8f,  0.8f),	tcu::Vec2(-0.5f, float(numLayers)+0.5f)));	// minification
				m_cases.push_back(FilterCase(tex0, tcu::Vec2(0.5f, 0.65f),	tcu::Vec2(0.8f,  0.8f),	tcu::Vec2(-0.5f, float(numLayers)+0.5f)));	// magnification
				m_cases.push_back(FilterCase(tex1, tcu::Vec2(-0.8f, -0.8f),	tcu::Vec2(0.8f,  0.8f),	tcu::Vec2(float(numLayers)+0.5f, -0.5f)));	// minification
				m_cases.push_back(FilterCase(tex1, tcu::Vec2(0.2f, 0.2f),	tcu::Vec2(0.6f,  0.5f),	tcu::Vec2(float(numLayers)+0.5f, -0.5f)));	// magnification
			}
			else
			{
				const bool isSingleSample = (m_context.getRenderTarget().getNumSamples() == 0);

				// minification - w/ tweak to avoid hitting triangle edges with a face switchpoint in multisample configs
				if (isSingleSample)
					m_cases.push_back(FilterCase(tex0, tcu::Vec2(-1.25f, -1.2f), tcu::Vec2(1.2f, 1.25f), tcu::Vec2(-0.5f, float(numLayers)+0.5f)));
				else
					m_cases.push_back(FilterCase(tex0, tcu::Vec2(-1.19f, -1.3f), tcu::Vec2(1.1f, 1.35f), tcu::Vec2(-0.5f, float(numLayers)+0.5f)));

				m_cases.push_back(FilterCase(tex0, tcu::Vec2(0.8f, 0.8f),		tcu::Vec2(1.25f, 1.20f),	tcu::Vec2(-0.5f, float(numLayers)+0.5f)));	// magnification
				m_cases.push_back(FilterCase(tex1, tcu::Vec2(-1.19f, -1.3f),	tcu::Vec2(1.1f, 1.35f),		tcu::Vec2(float(numLayers)+0.5f, -0.5f)));	// minification
				m_cases.push_back(FilterCase(tex1, tcu::Vec2(-1.2f, -1.1f),		tcu::Vec2(-0.8f, -0.8f),	tcu::Vec2(float(numLayers)+0.5f, -0.5f)));	// magnification

				// Layer rounding - only in single-sample configs as multisample configs may produce smooth transition at the middle.
				if (isSingleSample && (numLayers > 1))
					m_cases.push_back(FilterCase(tex0,	tcu::Vec2(-2.0f, -1.5f  ),	tcu::Vec2(-0.1f,  0.9f), tcu::Vec2(1.50001f, 1.49999f)));
			}
		}

		m_caseNdx = 0;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	catch (...)
	{
		// Clean up to save memory.
		TextureCubeArrayFilteringCase::deinit();
		throw;
	}
}